

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void read_sgrproj_filter(SgrprojInfo *sgrproj_info,SgrprojInfo *ref_sgrproj_info,aom_reader *rb)

{
  uint16_t uVar1;
  int iVar2;
  undefined8 *in_RSI;
  int *in_RDI;
  sgr_params_type *params;
  uint16_t in_stack_ffffffffffffffda;
  int in_stack_ffffffffffffffdc;
  uint16_t n;
  aom_reader *in_stack_ffffffffffffffe0;
  aom_reader *r;
  
  iVar2 = aom_read_literal_(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  *in_RDI = iVar2;
  r = (aom_reader *)(av1_sgr_params + *in_RDI);
  uVar1 = (uint16_t)in_stack_ffffffffffffffdc;
  n = (uint16_t)((uint)in_stack_ffffffffffffffdc >> 0x10);
  if (*(int *)&r->buffer == 0) {
    in_RDI[1] = 0;
    uVar1 = aom_read_primitive_refsubexpfin_(r,n,uVar1,in_stack_ffffffffffffffda);
    in_RDI[2] = uVar1 - 0x20;
  }
  else if (av1_sgr_params[*in_RDI].r[1] == 0) {
    uVar1 = aom_read_primitive_refsubexpfin_(r,n,uVar1,in_stack_ffffffffffffffda);
    in_RDI[1] = uVar1 - 0x60;
    iVar2 = clamp(0x80 - in_RDI[1],-0x20,0x5f);
    in_RDI[2] = iVar2;
  }
  else {
    uVar1 = aom_read_primitive_refsubexpfin_(r,n,uVar1,in_stack_ffffffffffffffda);
    in_RDI[1] = uVar1 - 0x60;
    uVar1 = aom_read_primitive_refsubexpfin_
                      (r,(uint16_t)((uint)in_stack_ffffffffffffffdc >> 0x10),
                       (uint16_t)in_stack_ffffffffffffffdc,in_stack_ffffffffffffffda);
    in_RDI[2] = uVar1 - 0x20;
  }
  *in_RSI = *(undefined8 *)in_RDI;
  *(int *)(in_RSI + 1) = in_RDI[2];
  return;
}

Assistant:

static inline void read_sgrproj_filter(SgrprojInfo *sgrproj_info,
                                       SgrprojInfo *ref_sgrproj_info,
                                       aom_reader *rb) {
  sgrproj_info->ep = aom_read_literal(rb, SGRPROJ_PARAMS_BITS, ACCT_STR);
  const sgr_params_type *params = &av1_sgr_params[sgrproj_info->ep];

  if (params->r[0] == 0) {
    sgrproj_info->xqd[0] = 0;
    sgrproj_info->xqd[1] =
        aom_read_primitive_refsubexpfin(
            rb, SGRPROJ_PRJ_MAX1 - SGRPROJ_PRJ_MIN1 + 1, SGRPROJ_PRJ_SUBEXP_K,
            ref_sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1, ACCT_STR) +
        SGRPROJ_PRJ_MIN1;
  } else if (params->r[1] == 0) {
    sgrproj_info->xqd[0] =
        aom_read_primitive_refsubexpfin(
            rb, SGRPROJ_PRJ_MAX0 - SGRPROJ_PRJ_MIN0 + 1, SGRPROJ_PRJ_SUBEXP_K,
            ref_sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0, ACCT_STR) +
        SGRPROJ_PRJ_MIN0;
    sgrproj_info->xqd[1] = clamp((1 << SGRPROJ_PRJ_BITS) - sgrproj_info->xqd[0],
                                 SGRPROJ_PRJ_MIN1, SGRPROJ_PRJ_MAX1);
  } else {
    sgrproj_info->xqd[0] =
        aom_read_primitive_refsubexpfin(
            rb, SGRPROJ_PRJ_MAX0 - SGRPROJ_PRJ_MIN0 + 1, SGRPROJ_PRJ_SUBEXP_K,
            ref_sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0, ACCT_STR) +
        SGRPROJ_PRJ_MIN0;
    sgrproj_info->xqd[1] =
        aom_read_primitive_refsubexpfin(
            rb, SGRPROJ_PRJ_MAX1 - SGRPROJ_PRJ_MIN1 + 1, SGRPROJ_PRJ_SUBEXP_K,
            ref_sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1, ACCT_STR) +
        SGRPROJ_PRJ_MIN1;
  }

  memcpy(ref_sgrproj_info, sgrproj_info, sizeof(*sgrproj_info));
}